

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_csvmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_CsvModelSerialiser::basicSaveLoadByteArrayNoHeader(tst_CsvModelSerialiser *this)

{
  QAbstractItemModel *sourceModel;
  QAbstractItemModel *destinationModel;
  undefined8 *puVar1;
  int iVar2;
  CsvModelSerialiser serialiser;
  CsvModelSerialiser aCStack_38 [24];
  
  iVar2 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar1 = (undefined8 *)QTest::qData("sourceModel",iVar2);
  sourceModel = (QAbstractItemModel *)*puVar1;
  iVar2 = qMetaTypeId<QAbstractItemModel*>();
  puVar1 = (undefined8 *)QTest::qData("destinationModel",iVar2);
  destinationModel = (QAbstractItemModel *)*puVar1;
  CsvModelSerialiser::CsvModelSerialiser(aCStack_38,(QObject *)0x0);
  CsvModelSerialiser::setFirstColumnIsHeader(SUB81(aCStack_38,0));
  CsvModelSerialiser::setFirstRowIsHeader(SUB81(aCStack_38,0));
  tst_SerialiserCommon::saveLoadByteArray
            (&this->super_tst_SerialiserCommon,(AbstractModelSerialiser *)aCStack_38,sourceModel,
             destinationModel,false,false);
  QObject::deleteLater();
  AbstractSingleRoleSerialiser::~AbstractSingleRoleSerialiser
            ((AbstractSingleRoleSerialiser *)aCStack_38);
  return;
}

Assistant:

void tst_CsvModelSerialiser::basicSaveLoadByteArrayNoHeader()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    CsvModelSerialiser serialiser;
    serialiser.setFirstColumnIsHeader(false);
    serialiser.setFirstRowIsHeader(false);
    saveLoadByteArray(&serialiser, sourceModel, destinationModel, false, false);
    destinationModel->deleteLater();
}